

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall re2::Compiler::Cat(Compiler *this,Frag a,Frag b)

{
  Inst *inst0;
  uint32 val;
  PatchList l;
  ulong uVar1;
  
  val = b.begin;
  if (val == 0 || ((ulong)a & 0xffffffff) == 0) {
    b.begin = 0;
    b.end.p = 0;
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)b >> 0x20;
    inst0 = this->inst_;
    l = a.end.p;
    if ((inst0[(ulong)a & 0xffffffff].out_opcode_ & 0xfffffff7) == 6 && a.begin * 2 == l.p) {
      PatchList::Patch(inst0,l,val);
    }
    else if (this->reversed_ == true) {
      PatchList::Patch(inst0,b.end.p,a.begin);
      uVar1 = (ulong)a >> 0x20;
    }
    else {
      PatchList::Patch(inst0,l,val);
      b = a;
    }
  }
  return (Frag)((ulong)b & 0xffffffff | uVar1 << 0x20);
}

Assistant:

Frag Compiler::Cat(Frag a, Frag b) {
  if (IsNoMatch(a) || IsNoMatch(b))
    return NoMatch();

  // Elide no-op.
  Prog::Inst* begin = &inst_[a.begin];
  if (begin->opcode() == kInstNop &&
      a.end.p == (a.begin << 1) &&
      begin->out() == 0) {
    PatchList::Patch(inst_, a.end, b.begin);  // in case refs to a somewhere
    return b;
  }

  // To run backward over string, reverse all concatenations.
  if (reversed_) {
    PatchList::Patch(inst_, b.end, a.begin);
    return Frag(b.begin, a.end);
  }

  PatchList::Patch(inst_, a.end, b.begin);
  return Frag(a.begin, b.end);
}